

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall capnp::DynamicValue::Builder::operator=(Builder *this,Builder *other)

{
  Builder *params;
  Builder *other_local;
  Builder *this_local;
  
  if (this->type == CAPABILITY) {
    kj::dtor<capnp::DynamicCapability::Client>(&(this->field_1).capabilityValue);
  }
  params = kj::mv<capnp::DynamicValue::Builder>(other);
  kj::ctor<capnp::DynamicValue::Builder,capnp::DynamicValue::Builder>(this,params);
  return this;
}

Assistant:

DynamicValue::Builder& DynamicValue::Builder::operator=(Builder&& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, kj::mv(other));
  return *this;
}